

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void do_supps(CHAR_DATA *ch,char *argument)

{
  byte bVar1;
  short sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  CClass *pCVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  size_t sVar11;
  BUFFER *buffer;
  long lVar12;
  skill_type *psVar13;
  int iVar14;
  uint uVar15;
  char spell_columns [52];
  char buf [4608];
  char arg [4608];
  char spell_list [52] [4608];
  byte abStack_3cc78 [64];
  char acStack_3cc38 [4608];
  char acStack_3ba38 [4608];
  char acStack_3a838 [5];
  undefined8 auStack_3a833 [29952];
  
  bVar3 = is_npc(ch);
  if (bVar3) {
    return;
  }
  pCVar7 = ch->my_class;
  if ((pCVar7 == (CClass *)0x0) &&
     ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
      (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
    pCVar7 = CClass::GetClass(0);
  }
  if ((pCVar7->ctype != 2) && (bVar3 = is_immortal(ch), !bVar3)) {
    send_to_char("Your class knows no prayers.\n\r",ch);
    return;
  }
  iVar14 = 1;
  iVar5 = 0x33;
  if ((*argument != '\0') && (bVar3 = str_prefix(argument,"all"), bVar3)) {
    pcVar8 = one_argument(argument,acStack_3ba38);
    bVar3 = is_number(acStack_3ba38);
    if (!bVar3) {
LAB_002d938d:
      pcVar8 = "Arguments must be numerical or all.\n\r";
      goto LAB_002d9394;
    }
    iVar4 = atoi(acStack_3ba38);
    if (iVar4 - 0x34U < 0xffffffcd) {
LAB_002d9075:
      pcVar8 = acStack_3cc38;
      sprintf(pcVar8,"Levels must be between 1 and %d.\n\r",0x33);
      goto LAB_002d9394;
    }
    iVar5 = iVar4;
    if (*pcVar8 != '\0') {
      one_argument(pcVar8,acStack_3ba38);
      bVar3 = is_number(acStack_3ba38);
      if (!bVar3) goto LAB_002d938d;
      iVar5 = atoi(acStack_3ba38);
      if (iVar5 - 0x34U < 0xffffffcd) goto LAB_002d9075;
      iVar14 = iVar4;
      if (iVar5 < iVar4) {
        pcVar8 = "That would be silly.\n\r";
        goto LAB_002d9394;
      }
    }
  }
  abStack_3cc78[0x20] = 0;
  abStack_3cc78[0x21] = 0;
  abStack_3cc78[0x22] = 0;
  abStack_3cc78[0x23] = 0;
  abStack_3cc78[0x24] = 0;
  abStack_3cc78[0x25] = 0;
  abStack_3cc78[0x26] = 0;
  abStack_3cc78[0x27] = 0;
  abStack_3cc78[0x28] = 0;
  abStack_3cc78[0x29] = 0;
  abStack_3cc78[0x2a] = 0;
  abStack_3cc78[0x2b] = 0;
  abStack_3cc78[0x2c] = 0;
  abStack_3cc78[0x2d] = 0;
  abStack_3cc78[0x2e] = 0;
  abStack_3cc78[0x2f] = 0;
  abStack_3cc78[0x10] = 0;
  abStack_3cc78[0x11] = 0;
  abStack_3cc78[0x12] = 0;
  abStack_3cc78[0x13] = 0;
  abStack_3cc78[0x14] = 0;
  abStack_3cc78[0x15] = 0;
  abStack_3cc78[0x16] = 0;
  abStack_3cc78[0x17] = 0;
  abStack_3cc78[0x18] = 0;
  abStack_3cc78[0x19] = 0;
  abStack_3cc78[0x1a] = 0;
  abStack_3cc78[0x1b] = 0;
  abStack_3cc78[0x1c] = 0;
  abStack_3cc78[0x1d] = 0;
  abStack_3cc78[0x1e] = 0;
  abStack_3cc78[0x1f] = 0;
  abStack_3cc78[0] = 0;
  abStack_3cc78[1] = 0;
  abStack_3cc78[2] = 0;
  abStack_3cc78[3] = 0;
  abStack_3cc78[4] = 0;
  abStack_3cc78[5] = 0;
  abStack_3cc78[6] = 0;
  abStack_3cc78[7] = 0;
  abStack_3cc78[8] = 0;
  abStack_3cc78[9] = 0;
  abStack_3cc78[10] = 0;
  abStack_3cc78[0xb] = 0;
  abStack_3cc78[0xc] = 0;
  abStack_3cc78[0xd] = 0;
  abStack_3cc78[0xe] = 0;
  abStack_3cc78[0xf] = 0;
  abStack_3cc78[0x30] = 0;
  abStack_3cc78[0x31] = 0;
  abStack_3cc78[0x32] = 0;
  abStack_3cc78[0x33] = 0;
  lVar9 = 0;
  do {
    acStack_3a838[lVar9] = '\0';
    lVar9 = lVar9 + 0x1200;
  } while (lVar9 != 0x3a800);
  psVar13 = skill_table;
  lVar9 = 0;
  bVar3 = false;
  do {
    if (psVar13->name == (char *)0x0) break;
    pCVar7 = ch->my_class;
    if ((pCVar7 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
      pCVar7 = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(pCVar7);
    sVar2 = psVar13->skill_level[iVar4];
    if (((((sVar2 <= iVar5) && (sVar2 < 0x34)) && (iVar14 <= sVar2)) &&
        ((psVar13->spell_fun != spell_null && (0 < ch->pcdata->learned[lVar9])))) &&
       ((psVar13->ctype == 4 || (psVar13->ctype == 2)))) {
      pCVar7 = ch->my_class;
      if ((pCVar7 == (CClass *)0x0) &&
         ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
          (pCVar7 = ch->pIndexData->my_class, pCVar7 == (CClass *)0x0)))) {
        pCVar7 = CClass::GetClass(0);
      }
      iVar4 = CClass::GetIndex(pCVar7);
      uVar15 = (uint)psVar13->skill_level[iVar4];
      if (ch->level < psVar13->skill_level[iVar4]) {
        sprintf(acStack_3cc38,"%-18s n/a      ",psVar13->name);
      }
      else {
        uVar6 = (uint)(100 / (long)(int)(((int)ch->level - uVar15) + 2));
        if ((int)uVar6 <= (int)psVar13->min_mana) {
          uVar6 = (int)psVar13->min_mana;
        }
        sprintf(acStack_3cc38,"%-18s  %3d mana  ",psVar13->name,(ulong)uVar6);
      }
      lVar10 = (long)(int)uVar15;
      lVar12 = lVar10 * 0x1200;
      pcVar8 = acStack_3a838 + lVar12;
      if (*pcVar8 == '\0') {
        sprintf(pcVar8,"\n\rLevel %2d: %s",(ulong)uVar15,acStack_3cc38);
      }
      else {
        bVar1 = abStack_3cc78[lVar10];
        abStack_3cc78[lVar10] = bVar1 + 1;
        if ((bVar1 & 1) != 0) {
          sVar11 = strlen(pcVar8);
          builtin_strncpy(acStack_3a838 + sVar11 + lVar12,"\n\r      ",8);
          *(undefined8 *)((long)auStack_3a833 + sVar11 + lVar12) = 0x20202020202020;
        }
        strcat(pcVar8,acStack_3cc38);
      }
      bVar3 = true;
    }
    lVar9 = lVar9 + 1;
    psVar13 = psVar13 + 1;
  } while (lVar9 != 800);
  if (bVar3) {
    lVar9 = 0;
    buffer = new_buf();
    do {
      if (acStack_3a838[lVar9] != '\0') {
        add_buf(buffer,acStack_3a838 + lVar9);
      }
      lVar9 = lVar9 + 0x1200;
    } while (lVar9 != 0x3a800);
    add_buf(buffer,"\n\r");
    pcVar8 = buf_string(buffer);
    page_to_char(pcVar8,ch);
    free_buf(buffer);
    return;
  }
  pcVar8 = "No spells found.\n\r";
LAB_002d9394:
  send_to_char(pcVar8,ch);
  return;
}

Assistant:

void do_supps(CHAR_DATA *ch, char *argument)
{
	BUFFER *buffer;
	char arg[MAX_INPUT_LENGTH];
	char spell_list[LEVEL_HERO + 1][MAX_STRING_LENGTH];
	char spell_columns[LEVEL_HERO + 1];
	int sn, level, min_lev = 1, max_lev = LEVEL_HERO, mana;
	bool fAll= false, found= false;
	char buf[MAX_STRING_LENGTH];

	if (is_npc(ch))
		return;

	if (ch->Class()->ctype != CLASS_COMMUNER && !is_immortal(ch))
	{
		send_to_char("Your class knows no prayers.\n\r", ch);
		return;
	}

	if (argument[0] != '\0')
	{
		fAll = true;

		if (str_prefix(argument, "all"))
		{
			argument = one_argument(argument, arg);

			if (!is_number(arg))
			{
				send_to_char("Arguments must be numerical or all.\n\r", ch);
				return;
			}

			max_lev = atoi(arg);

			if (max_lev < 1 || max_lev > LEVEL_HERO)
			{
				sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
				send_to_char(buf, ch);
				return;
			}

			if (argument[0] != '\0')
			{
				argument = one_argument(argument, arg);
				if (!is_number(arg))
				{
					send_to_char("Arguments must be numerical or all.\n\r", ch);
					return;
				}

				min_lev = max_lev;
				max_lev = atoi(arg);

				if (max_lev < 1 || max_lev > LEVEL_HERO)
				{
					sprintf(buf, "Levels must be between 1 and %d.\n\r", LEVEL_HERO);
					send_to_char(buf, ch);
					return;
				}

				if (min_lev > max_lev)
				{
					send_to_char("That would be silly.\n\r", ch);
					return;
				}
			}
		}
	}

	/* initialize data */
	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		spell_columns[level] = 0;
		spell_list[level][0] = '\0';
	}

	for (sn = 0; sn < MAX_SKILL; sn++)
	{
		if (skill_table[sn].name == nullptr)
			break;

		level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

		if (level < LEVEL_HERO + 1
			&& level >= min_lev
			&& level <= max_lev
			&& skill_table[sn].spell_fun != spell_null
			&& ch->pcdata->learned[sn] > 0
			&& (skill_table[sn].ctype == CMD_COMMUNE || skill_table[sn].ctype == CMD_BOTH))
		{
			found = true;
			level = skill_table[sn].skill_level[ch->Class()->GetIndex()];

			if (ch->level < level)
			{
				sprintf(buf, "%-18s n/a      ", skill_table[sn].name);
			}
			else
			{
				mana = std::max((int)skill_table[sn].min_mana, 100 / (2 + ch->level - level));
				sprintf(buf, "%-18s  %3d mana  ", skill_table[sn].name, mana);
			}

			if (spell_list[level][0] == '\0')
			{
				sprintf(spell_list[level], "\n\rLevel %2d: %s", level, buf);
			}
			else /* append */
			{
				if (++spell_columns[level] % 2 == 0)
					strcat(spell_list[level], "\n\r          ");

				strcat(spell_list[level], buf);
			}
		}
	}

	/* return results */

	if (!found)
	{
		send_to_char("No spells found.\n\r", ch);
		return;
	}

	buffer = new_buf();

	for (level = 0; level < LEVEL_HERO + 1; level++)
	{
		if (spell_list[level][0] != '\0')
			add_buf(buffer, spell_list[level]);
	}

	add_buf(buffer, "\n\r");
	page_to_char(buf_string(buffer), ch);
	free_buf(buffer);
}